

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Module.cpp
# Opt level: O0

Structure * __thiscall soul::Module::Structs::add(Structs *this,Structure *s)

{
  bool condition;
  string *this_00;
  string_view name;
  RefCountedPtr<soul::Structure> local_48 [3];
  undefined1 local_30 [16];
  Structure *local_18;
  Structure *s_local;
  Structs *this_local;
  
  local_18 = s;
  s_local = (Structure *)this;
  this_00 = Structure::getName_abi_cxx11_(s);
  local_30 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
  name._M_str = local_30._0_8_;
  name._M_len = (size_t)this;
  find((Structs *)&stack0xffffffffffffffe0,name);
  condition = RefCountedPtr<soul::Structure>::operator==
                        ((RefCountedPtr<soul::Structure> *)&stack0xffffffffffffffe0,(Structure *)0x0
                        );
  checkAssertion(condition,"find (s.getName()) == nullptr","add",0x74);
  RefCountedPtr<soul::Structure>::~RefCountedPtr
            ((RefCountedPtr<soul::Structure> *)&stack0xffffffffffffffe0);
  RefCountedPtr<soul::Structure>::RefCountedPtr(local_48,local_18);
  ArrayWithPreallocation<soul::RefCountedPtr<soul::Structure>,_32UL>::push_back
            (&this->structs,local_48);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(local_48);
  return local_18;
}

Assistant:

Structure& Module::Structs::add (Structure& s)
{
    SOUL_ASSERT (find (s.getName()) == nullptr);
    structs.push_back (s);
    return s;
}